

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonConvert.h
# Opt level: O2

void __thiscall
Json::JsonConvert::JsonConvert(JsonConvert *this,FILE *fp,bool format,int indent,bool escape)

{
  JsonParser local_90;
  
  JsonParser::JsonParser(&local_90,fp);
  JsonConvert(this,&local_90,format,indent,escape);
  JsonParser::~JsonParser(&local_90);
  return;
}

Assistant:

explicit JsonConvert(FILE *fp, bool format = false, int indent = 4, bool escape = false)
                : JsonConvert(JsonParser(fp), format, indent, escape) {}